

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
Parser::parseLabel(Parser *this)

{
  pointer pcVar1;
  bool bVar2;
  Token *token;
  Token *pTVar3;
  CAssemblerLabel *this_00;
  Parser *in_RSI;
  ValueType *__v;
  string local_68;
  Identifier local_48;
  
  updateFileInfo(in_RSI);
  token = Tokenizer::peekToken
                    ((in_RSI->entries).
                     super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
  pTVar3 = Tokenizer::peekToken
                     ((in_RSI->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
  if ((pTVar3->type == Identifier) &&
     (pTVar3 = Tokenizer::peekToken
                         ((in_RSI->entries).
                          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,1),
     pTVar3->type == Colon)) {
    if (*(__index_type *)
         ((long)&(token->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
         + 0x20) != '\x04') {
      __assert_fail("std::holds_alternative<Identifier>(value)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                    ,0x4d,"const Identifier &Token::identifierValue() const");
    }
    __v = &token->value;
    Tokenizer::eatTokens
              ((in_RSI->entries).
               super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].tokenizer,2);
    if (in_RSI->initializingMacro == true) {
      std::
      _Rb_tree<Identifier,Identifier,std::_Identity<Identifier>,std::less<Identifier>,std::allocator<Identifier>>
      ::_M_insert_unique<Identifier_const&>
                ((_Rb_tree<Identifier,Identifier,std::_Identity<Identifier>,std::less<Identifier>,std::allocator<Identifier>>
                  *)&in_RSI->macroLabels,(Identifier *)__v);
    }
    bVar2 = SymbolTable::isValidSymbolName((Identifier *)__v);
    if (bVar2) {
      pcVar1 = (token->originalText)._M_dataplus._M_p;
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar1,pcVar1 + (token->originalText)._M_string_length);
      Identifier::Identifier(&local_48,&local_68);
      this_00 = (CAssemblerLabel *)operator_new(0x48);
      CAssemblerLabel::CAssemblerLabel(this_00,(Identifier *)__v,&local_48,(optional<bool>)0x0);
      (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._name._M_dataplus._M_p != &local_48._name.field_2) {
        operator_delete(local_48._name._M_dataplus._M_p,
                        local_48._name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p == &local_68.field_2) {
        return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>
                )(__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>
                  )this;
      }
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>
             )(__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>
               )this;
    }
    printError<Identifier>(in_RSI,token,"Invalid label name \"%s\"",(Identifier *)__v);
  }
  (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> Parser::parseLabel()
{
	updateFileInfo();

	const Token& start = peekToken(0);

	if (peekToken(0).type == TokenType::Identifier &&
		peekToken(1).type == TokenType::Colon)
	{
		const Identifier &name = start.identifierValue();
		eatTokens(2);
		
		if (initializingMacro)
			macroLabels.insert(name);
		
		if (!Global.symbolTable.isValidSymbolName(name))
		{
			printError(start, "Invalid label name \"%s\"",name);
			return nullptr;
		}

		return std::make_unique<CAssemblerLabel>(name,Identifier(start.getOriginalText()));
	}

	return nullptr;
}